

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O1

int mbedtls_ssl_get_record_expansion(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_transform *pmVar1;
  mbedtls_cipher_info_t *pmVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  pmVar1 = ssl->transform_out;
  iVar4 = (int)ssl->out_iv - (int)ssl->out_hdr;
  if (pmVar1 == (mbedtls_ssl_transform *)0x0) {
    return iVar4;
  }
  pmVar2 = (pmVar1->cipher_ctx_enc).cipher_info;
  if (pmVar2 == (mbedtls_cipher_info_t *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(uint *)&pmVar2->field_0x8 >> 0xc & 0xf;
  }
  if (2 < uVar5 - 6) {
    if (uVar5 == 2) {
      if (pmVar2 == (mbedtls_cipher_info_t *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(int *)&pmVar2->field_0x8 * 2 & 0x3e;
      }
      iVar3 = uVar5 + (int)pmVar1->maclen;
      goto LAB_00206172;
    }
    if (uVar5 != 0xb) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x1553,"should never happen");
      return -0x6c00;
    }
  }
  iVar3 = (int)pmVar1->minlen;
LAB_00206172:
  return iVar3 + iVar4;
}

Assistant:

int mbedtls_ssl_get_record_expansion(const mbedtls_ssl_context *ssl)
{
    size_t transform_expansion = 0;
    const mbedtls_ssl_transform *transform = ssl->transform_out;
    unsigned block_size;
#if defined(MBEDTLS_USE_PSA_CRYPTO)
    psa_key_attributes_t attr = PSA_KEY_ATTRIBUTES_INIT;
    psa_key_type_t key_type;
#endif /* MBEDTLS_USE_PSA_CRYPTO */

    size_t out_hdr_len = mbedtls_ssl_out_hdr_len(ssl);

    if (transform == NULL) {
        return (int) out_hdr_len;
    }


#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if (transform->psa_alg == PSA_ALG_GCM ||
        transform->psa_alg == PSA_ALG_CCM ||
        transform->psa_alg == PSA_ALG_AEAD_WITH_SHORTENED_TAG(PSA_ALG_CCM, 8) ||
        transform->psa_alg == PSA_ALG_CHACHA20_POLY1305 ||
        transform->psa_alg == MBEDTLS_SSL_NULL_CIPHER) {
        transform_expansion = transform->minlen;
    } else if (transform->psa_alg == PSA_ALG_CBC_NO_PADDING) {
        (void) psa_get_key_attributes(transform->psa_key_enc, &attr);
        key_type = psa_get_key_type(&attr);

        block_size = PSA_BLOCK_CIPHER_BLOCK_LENGTH(key_type);

        /* Expansion due to the addition of the MAC. */
        transform_expansion += transform->maclen;

        /* Expansion due to the addition of CBC padding;
         * Theoretically up to 256 bytes, but we never use
         * more than the block size of the underlying cipher. */
        transform_expansion += block_size;

        /* For TLS 1.2 or higher, an explicit IV is added
         * after the record header. */
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        transform_expansion += block_size;
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
    } else {
        MBEDTLS_SSL_DEBUG_MSG(1,
                              ("Unsupported psa_alg spotted in mbedtls_ssl_get_record_expansion()"));
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }
#else
    switch (mbedtls_cipher_get_cipher_mode(&transform->cipher_ctx_enc)) {
        case MBEDTLS_MODE_GCM:
        case MBEDTLS_MODE_CCM:
        case MBEDTLS_MODE_CHACHAPOLY:
        case MBEDTLS_MODE_STREAM:
            transform_expansion = transform->minlen;
            break;

        case MBEDTLS_MODE_CBC:

            block_size = mbedtls_cipher_get_block_size(
                &transform->cipher_ctx_enc);

            /* Expansion due to the addition of the MAC. */
            transform_expansion += transform->maclen;

            /* Expansion due to the addition of CBC padding;
             * Theoretically up to 256 bytes, but we never use
             * more than the block size of the underlying cipher. */
            transform_expansion += block_size;

            /* For TLS 1.2 or higher, an explicit IV is added
             * after the record header. */
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
            transform_expansion += block_size;
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

            break;

        default:
            MBEDTLS_SSL_DEBUG_MSG(1, ("should never happen"));
            return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO */

#if defined(MBEDTLS_SSL_DTLS_CONNECTION_ID)
    if (transform->out_cid_len != 0) {
        transform_expansion += MBEDTLS_SSL_MAX_CID_EXPANSION;
    }
#endif /* MBEDTLS_SSL_DTLS_CONNECTION_ID */

    return (int) (out_hdr_len + transform_expansion);
}